

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

bool UTF_U_to_u<(char)63>(UTF_US32 *us32,UTF_US16 *us16)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  char16_t __c;
  long lVar4;
  UTF_UC16 uc16 [2];
  char16_t local_2c;
  char16_t local_2a;
  
  pcVar1 = (us32->_M_dataplus)._M_p;
  sVar2 = us32->_M_string_length;
  lVar4 = 0;
  do {
    if (sVar2 << 2 == lVar4) {
      return true;
    }
    bVar3 = UTF_uc32_to_uc16(*(UTF_UC32 *)((long)pcVar1 + lVar4),&local_2c);
    __c = L'?';
    if (bVar3) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(us16,local_2c);
      __c = local_2a;
      if (local_2a != L'\0') goto LAB_001036e7;
    }
    else {
LAB_001036e7:
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(us16,__c);
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

inline bool
UTF_U_to_u(const UTF_US32& us32, UTF_US16& us16)
{
    UTF_UC16 uc16[2];
    UTF_US32::const_iterator it, end = us32.end();
    for (it = us32.begin(); it != end; ++it)
    {
        if (!UTF_uc32_to_uc16(*it, uc16))
        {
            if (!t_default_char)
                return false;

            us16.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us16.push_back(uc16[0]);
        if (uc16[1])
        {
            us16.push_back(uc16[1]);
        }
    }

    return true;
}